

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::detail::Static_Caster<MyException,_std::runtime_error>::cast
          (Static_Caster<MyException,_std::runtime_error> *this,Boxed_Value *t_from)

{
  uint uVar1;
  element_type *peVar2;
  type_info *ptVar3;
  type_info *ptVar4;
  bool bVar5;
  reference_wrapper<std::runtime_error> obj;
  reference_wrapper<const_std::runtime_error> obj_00;
  undefined8 *puVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar8;
  Boxed_Value BVar9;
  shared_ptr<const_std::runtime_error> local_48;
  Type_Info local_38;
  
  local_38.m_type_info = (type_info *)&MyException::typeinfo;
  local_38.m_bare_type_info = (type_info *)&MyException::typeinfo;
  local_38._16_8_ = local_38._16_8_ & 0xffffffff00000000;
  bVar5 = Type_Info::bare_equal
                    (&((t_from->m_data).
                       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_type_info,&local_38);
  if (!bVar5) {
    puVar6 = (undefined8 *)__cxa_allocate_exception(0x38);
    peVar2 = (t_from->m_data).
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_38.m_flags = (peVar2->m_type_info).m_flags;
    local_38._20_4_ = *(undefined4 *)&(peVar2->m_type_info).field_0x14;
    ptVar3 = (peVar2->m_type_info).m_type_info;
    ptVar4 = (peVar2->m_type_info).m_bare_type_info;
    *puVar6 = &PTR__bad_cast_005a4ab0;
    local_38.m_type_info._0_4_ = SUB84(ptVar3,0);
    local_38.m_type_info._4_4_ = (undefined4)((ulong)ptVar3 >> 0x20);
    local_38.m_bare_type_info._0_4_ = SUB84(ptVar4,0);
    local_38.m_bare_type_info._4_4_ = (undefined4)((ulong)ptVar4 >> 0x20);
    *(undefined4 *)(puVar6 + 1) = local_38.m_type_info._0_4_;
    *(undefined4 *)((long)puVar6 + 0xc) = local_38.m_type_info._4_4_;
    *(undefined4 *)(puVar6 + 2) = local_38.m_bare_type_info._0_4_;
    *(undefined4 *)((long)puVar6 + 0x14) = local_38.m_bare_type_info._4_4_;
    puVar6[3] = local_38._16_8_;
    puVar6[4] = &std::runtime_error::typeinfo;
    puVar6[5] = 0x1f;
    puVar6[6] = "Unknown dynamic_cast_conversion";
    *puVar6 = &PTR__bad_cast_005a5dd8;
    local_38.m_type_info = ptVar3;
    local_38.m_bare_type_info = ptVar4;
    __cxa_throw(puVar6,&chaiscript::exception::bad_boxed_dynamic_cast::typeinfo,
                std::bad_cast::~bad_cast);
  }
  peVar2 = (t_from->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar1 = (peVar2->m_type_info).m_flags;
  if (peVar2->m_is_ref == false) {
    if ((uVar1 & 1) == 0) {
      Cast_Helper_Inner<std::shared_ptr<MyException>_>::cast
                ((Boxed_Value *)&local_38,(Type_Conversions_State *)t_from);
      if (local_38.m_type_info == (type_info *)0x0) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = std::__cxx11::stringbuf::str;
        __cxa_throw(puVar6,&std::bad_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      local_48.super___shared_ptr<const_std::runtime_error,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_38.m_type_info;
      local_48.super___shared_ptr<const_std::runtime_error,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.m_bare_type_info;
      sVar8 = Boxed_Value::Object_Data::get<std::runtime_error>
                        ((Object_Data *)this,(shared_ptr<std::runtime_error> *)&local_48,false);
      _Var7 = sVar8.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    }
    else {
      Cast_Helper_Inner<std::shared_ptr<const_MyException>_>::cast
                ((Boxed_Value *)&local_38,(Type_Conversions_State *)t_from);
      if (local_38.m_type_info == (type_info *)0x0) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = std::__cxx11::stringbuf::str;
        __cxa_throw(puVar6,&std::bad_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      local_48.super___shared_ptr<const_std::runtime_error,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_38.m_type_info;
      local_48.super___shared_ptr<const_std::runtime_error,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.m_bare_type_info;
      sVar8 = Boxed_Value::Object_Data::get<std::runtime_error_const>
                        ((Object_Data *)this,&local_48,false);
      _Var7 = sVar8.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    }
    if (local_48.super___shared_ptr<const_std::runtime_error,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.super___shared_ptr<const_std::runtime_error,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var7._M_pi = extraout_RDX;
    }
  }
  else if ((uVar1 & 1) == 0) {
    obj._M_data = (runtime_error *)
                  verify_type<void>(t_from,(type_info *)&MyException::typeinfo,peVar2->m_data_ptr);
    sVar8 = Boxed_Value::Object_Data::get<std::runtime_error>((Object_Data *)this,obj,false);
    _Var7 = sVar8.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  else {
    obj_00._M_data =
         (runtime_error *)
         verify_type<void>(t_from,(type_info *)&MyException::typeinfo,peVar2->m_const_data_ptr);
    sVar8 = Boxed_Value::Object_Data::get<std::runtime_error_const>
                      ((Object_Data *)this,obj_00,false);
    _Var7 = sVar8.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var7._M_pi;
  BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value cast(const Boxed_Value &t_from) {
        if (t_from.get_type_info().bare_equal(chaiscript::user_type<From>())) {
          if (t_from.is_pointer()) {
            // Dynamic cast out the contained boxed value, which we know is the type we want
            if (t_from.is_const()) {
              return Boxed_Value([&]() {
                if (auto data
                    = std::static_pointer_cast<const To>(detail::Cast_Helper<std::shared_ptr<const From>>::cast(t_from, nullptr))) {
                  return data;
                } else {
                  throw std::bad_cast();
                }
              }());
            } else {
              return Boxed_Value([&]() {
                if (auto data = std::static_pointer_cast<To>(detail::Cast_Helper<std::shared_ptr<From>>::cast(t_from, nullptr))) {
                  return data;
                } else {
                  throw std::bad_cast();
                }
              }());
            }
          } else {
            // Pull the reference out of the contained boxed value, which we know is the type we want
            if (t_from.is_const()) {
              const From &d = detail::Cast_Helper<const From &>::cast(t_from, nullptr);
              const To &data = static_cast<const To &>(d);
              return Boxed_Value(std::cref(data));
            } else {
              From &d = detail::Cast_Helper<From &>::cast(t_from, nullptr);
              To &data = static_cast<To &>(d);
              return Boxed_Value(std::ref(data));
            }
          }
        } else {
          throw chaiscript::exception::bad_boxed_dynamic_cast(t_from.get_type_info(), typeid(To), "Unknown dynamic_cast_conversion");
        }
      }